

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

SyntaxList<slang::syntax::AttributeInstanceSyntax> *
slang::syntax::deepClone<slang::syntax::AttributeInstanceSyntax>
          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *node,BumpAllocator *alloc)

{
  size_t sVar1;
  pointer ppAVar2;
  int iVar3;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  long lVar5;
  DeepCloneVisitor visitor;
  SmallVector<slang::syntax::AttributeInstanceSyntax_*,_5UL> buffer;
  DeepCloneVisitor local_81;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> local_80;
  SmallVector<slang::syntax::AttributeInstanceSyntax_*,_5UL> local_70;
  
  SmallVector<slang::syntax::AttributeInstanceSyntax_*,_5UL>::SmallVector
            (&local_70,
             (node->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
             _M_extent._M_extent_value);
  sVar1 = (node->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  src = extraout_RDX;
  if (sVar1 != 0) {
    ppAVar2 = (node->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
              _M_ptr;
    lVar5 = 0;
    do {
      local_80._M_ptr =
           (pointer)detail::
                    visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                              (*(SyntaxNode **)((long)ppAVar2 + lVar5),&local_81,alloc);
      SmallVectorBase<slang::syntax::AttributeInstanceSyntax*>::
      emplace_back<slang::syntax::AttributeInstanceSyntax*>
                ((SmallVectorBase<slang::syntax::AttributeInstanceSyntax*> *)&local_70,
                 (AttributeInstanceSyntax **)&local_80);
      lVar5 = lVar5 + 8;
      src = extraout_RDX_00;
    } while (sVar1 << 3 != lVar5);
  }
  iVar3 = SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>::copy
                    (&local_70.super_SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>,
                     (EVP_PKEY_CTX *)alloc,src);
  local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  pSVar4 = BumpAllocator::
           emplace<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>>
                     (alloc,&local_80);
  if (local_70.super_SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>.data_ !=
      (pointer)local_70.super_SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>.firstElement
     ) {
    operator_delete(local_70.super_SmallVectorBase<slang::syntax::AttributeInstanceSyntax_*>.data_);
  }
  return pSVar4;
}

Assistant:

SyntaxList<T>* deepClone(const SyntaxList<T>& node, BumpAllocator& alloc) {
    SmallVector<T*> buffer(node.size(), UninitializedTag());
    for (auto& t : node)
        buffer.push_back(deepClone(*t, alloc));

    return alloc.emplace<SyntaxList<T>>(buffer.copy(alloc));
}